

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::Clear(UniDirectionalLSTMLayerParams *this)

{
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
            (&(this->activations_).super_RepeatedPtrFieldBase);
  if (this->params_ != (LSTMParams *)0x0) {
    (*(this->params_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->params_ = (LSTMParams *)0x0;
  if (this->weightparams_ != (LSTMWeightParams *)0x0) {
    (*(this->weightparams_->super_MessageLite)._vptr_MessageLite[1])();
  }
  *(undefined8 *)((long)&this->inputvectorsize_ + 1) = 0;
  *(undefined8 *)((long)&this->outputvectorsize_ + 1) = 0;
  this->weightparams_ = (LSTMWeightParams *)0x0;
  this->inputvectorsize_ = 0;
  return;
}

Assistant:

void UniDirectionalLSTMLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.UniDirectionalLSTMLayerParams)
  activations_.Clear();
  if (GetArenaNoVirtual() == NULL && params_ != NULL) {
    delete params_;
  }
  params_ = NULL;
  if (GetArenaNoVirtual() == NULL && weightparams_ != NULL) {
    delete weightparams_;
  }
  weightparams_ = NULL;
  ::memset(&inputvectorsize_, 0, reinterpret_cast<char*>(&reverseinput_) -
    reinterpret_cast<char*>(&inputvectorsize_) + sizeof(reverseinput_));
}